

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  ulong uVar1;
  int iVar2;
  int _c_h;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  uchar *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  uchar *puVar16;
  int _c_w;
  byte *pbVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  byte *_dst_00;
  byte *pbVar22;
  uchar *local_f0;
  
  local_f0 = _dst + _y4m->pic_h * _y4m->pic_w;
  _c_w = (_y4m->pic_w + 1) / 2;
  uVar19 = (long)(_y4m->pic_h + _y4m->dst_c_dec_h + -1) / (long)_y4m->dst_c_dec_h;
  _c_h = (int)uVar19;
  iVar8 = _c_h * _c_w;
  uVar20 = 2;
  if (_c_h < 2) {
    uVar20 = uVar19;
  }
  uVar15 = uVar20 & 0xffffffff;
  iVar13 = _c_h + -1;
  uVar1 = 3;
  if (_c_h < 3) {
    uVar1 = uVar19;
  }
  uVar19 = uVar1 & 0xffffffff;
  lVar21 = (long)_c_w;
  if ((int)uVar20 < 1) {
    uVar15 = 0;
  }
  iVar10 = 0;
  if (0 < _c_w) {
    iVar10 = _c_w;
  }
  if ((int)uVar1 < 1) {
    uVar19 = 0;
  }
  _dst_00 = _aux + iVar8 * 2;
  for (iVar5 = 1; iVar5 != 3; iVar5 = iVar5 + 1) {
    y4m_42xmpeg2_42xjpeg_helper(_dst_00,_aux,_c_w,_c_h);
    if (iVar5 == 1) {
      puVar7 = local_f0 + lVar21 * uVar19;
      puVar16 = puVar7;
      pbVar17 = _dst_00 + (uVar19 - 3) * lVar21;
      pbVar22 = _dst_00;
      for (lVar6 = 0; (int)lVar6 != iVar10; lVar6 = lVar6 + 1) {
        lVar14 = 0;
        uVar20 = 0;
        while (uVar19 != uVar20) {
          iVar9 = (int)uVar20;
          iVar11 = 1;
          if (1 < iVar9) {
            iVar11 = iVar9;
          }
          uVar20 = uVar20 + 1;
          iVar18 = iVar13;
          if ((int)uVar20 < iVar13) {
            iVar18 = (int)uVar20;
          }
          iVar2 = iVar9 + 2;
          if (iVar13 <= iVar9 + 2) {
            iVar2 = iVar13;
          }
          iVar11 = (int)((uint)pbVar22[iVar18 * _c_w] * -0x11 + (uint)pbVar22[lVar14] * 0x72 +
                         (uint)pbVar22[(iVar11 + -1) * _c_w] * 0x23 + (uint)*pbVar22 * -8 +
                         (uint)pbVar22[iVar2 * _c_w] * 4 + 0x40) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          local_f0[lVar14] = (uchar)iVar11;
          lVar14 = lVar14 + lVar21;
        }
        lVar12 = 0;
        lVar14 = lVar6;
        for (uVar20 = uVar19; (long)uVar20 < (long)(_c_h + -2); uVar20 = uVar20 + 1) {
          lVar3 = lVar21 + lVar21 + lVar12;
          lVar4 = lVar21 + lVar3;
          iVar11 = (int)((uint)pbVar17[lVar21 + lVar4] * -0x11 +
                         (uint)pbVar17[lVar21 + lVar3] * 0x72 +
                         (uint)pbVar17[lVar21 + lVar21 + lVar12] * 0x23 +
                         (uint)pbVar17[lVar21 + lVar12] * -9 + (uint)pbVar17[lVar12] +
                         (uint)pbVar17[lVar21 * 2 + lVar4] * 4 + 0x40) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          puVar16[lVar12] = (uchar)iVar11;
          lVar12 = lVar12 + lVar21;
          lVar14 = lVar14 + lVar21;
        }
        while ((long)uVar20 < (long)_c_h) {
          uVar20 = uVar20 + 1;
          iVar11 = iVar13;
          if ((int)uVar20 < iVar13) {
            iVar11 = (int)uVar20;
          }
          iVar11 = (int)((uint)_dst_00[lVar14 + lVar21 * uVar19] * 0x72 +
                         (uint)_dst_00[lVar14 + (uVar19 - 1) * lVar21] * 0x23 +
                         (uint)_dst_00[lVar14 + (uVar19 - 2) * lVar21] * -9 +
                         (uint)(_dst_00 + (uVar19 - 3) * lVar21)[lVar14] +
                         (uint)pbVar22[iVar11 * _c_w] * -0x11 + (uint)pbVar22[iVar13 * _c_w] * 4 +
                        0x40) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          puVar7[lVar14] = (uchar)iVar11;
          lVar14 = lVar14 + lVar21;
        }
        local_f0 = local_f0 + 1;
        pbVar22 = pbVar22 + 1;
        pbVar17 = pbVar17 + 1;
        puVar16 = puVar16 + 1;
      }
      local_f0 = local_f0 + (iVar8 - _c_w);
      pbVar22 = pbVar22 + -_c_w;
    }
    else {
      puVar16 = local_f0 + lVar21 * uVar15;
      puVar7 = puVar16;
      pbVar17 = _dst_00 + (uVar15 - 2) * lVar21;
      pbVar22 = _dst_00;
      for (lVar6 = 0; (int)lVar6 != iVar10; lVar6 = lVar6 + 1) {
        lVar14 = 0;
        uVar20 = 0;
        while (uVar15 != uVar20) {
          iVar9 = (int)(uVar20 + 1);
          iVar11 = iVar13;
          if (iVar9 < iVar13) {
            iVar11 = iVar9;
          }
          iVar9 = (int)uVar20 + 2;
          if (iVar13 <= iVar9) {
            iVar9 = iVar13;
          }
          iVar18 = (int)uVar20 + 3;
          if (iVar13 <= iVar18) {
            iVar18 = iVar13;
          }
          iVar11 = (int)((uint)pbVar22[iVar18 * _c_w] +
                         (uint)pbVar22[lVar14] * 0x72 + (uint)*pbVar22 * -0xd +
                         (uint)pbVar22[iVar11 * _c_w] * 0x23 + (uint)pbVar22[iVar9 * _c_w] * -9 +
                        0x40) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          local_f0[lVar14] = (uchar)iVar11;
          lVar14 = lVar14 + lVar21;
          uVar20 = uVar20 + 1;
        }
        lVar12 = 0;
        lVar14 = lVar6;
        for (uVar20 = uVar15; (long)uVar20 < (long)(_c_h + -3); uVar20 = uVar20 + 1) {
          lVar3 = lVar21 + lVar21 + lVar12;
          lVar4 = lVar21 + lVar3;
          iVar11 = (int)((uint)pbVar17[lVar21 + lVar12] * -0x11 + (uint)pbVar17[lVar12] * 4 +
                         (uint)pbVar17[lVar21 + lVar21 + lVar12] * 0x72 +
                         (uint)pbVar17[lVar21 + lVar3] * 0x23 + (uint)pbVar17[lVar21 + lVar4] * -9 +
                         (uint)pbVar17[lVar21 * 2 + lVar4] + 0x40) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          puVar7[lVar12] = (uchar)iVar11;
          lVar12 = lVar12 + lVar21;
          lVar14 = lVar14 + lVar21;
        }
        while ((long)uVar20 < (long)_c_h) {
          iVar9 = (int)(uVar20 + 1);
          iVar11 = iVar13;
          if (iVar9 < iVar13) {
            iVar11 = iVar9;
          }
          iVar9 = (int)uVar20 + 2;
          if (iVar13 <= iVar9) {
            iVar9 = iVar13;
          }
          iVar11 = (int)((uint)pbVar22[iVar13 * _c_w] +
                         (uint)_dst_00[lVar14 + (uVar15 - 1) * lVar21] * -0x11 +
                         (uint)(_dst_00 + (uVar15 - 2) * lVar21)[lVar14] * 4 +
                         (uint)_dst_00[lVar14 + lVar21 * uVar15] * 0x72 +
                         (uint)pbVar22[iVar11 * _c_w] * 0x23 + (uint)pbVar22[iVar9 * _c_w] * -9 +
                        0x40) >> 7;
          if (0xfe < iVar11) {
            iVar11 = 0xff;
          }
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          puVar16[lVar14] = (uchar)iVar11;
          lVar14 = lVar14 + lVar21;
          uVar20 = uVar20 + 1;
        }
        local_f0 = local_f0 + 1;
        pbVar22 = pbVar22 + 1;
        pbVar17 = pbVar17 + 1;
        puVar7 = puVar7 + 1;
      }
    }
    _aux = _aux + iVar8;
    _dst_00 = pbVar22;
  }
  return;
}

Assistant:

static void y4m_convert_42xpaldv_42xjpeg(y4m_input *_y4m, unsigned char *_dst,
                                         unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + 1) / 2;
  c_h = (_y4m->pic_h + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  c_sz = c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*First do the horizontal re-sampling.
      This is the same as the mpeg2 case, except that after the horizontal
       case, we need to apply a second vertical filter.*/
    y4m_42xmpeg2_42xjpeg_helper(tmp, _aux, c_w, c_h);
    _aux += c_sz;
    switch (pli) {
      case 1: {
        /*Slide C_b up a quarter-pel.
          This is the same filter used above, but in the other order.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 3); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[0] - 9 * tmp[OC_MAXI(y - 2, 0) * c_w] +
                 35 * tmp[OC_MAXI(y - 1, 0) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 2; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[(y + 1) * c_w] + 4 * tmp[(y + 2) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (tmp[(y - 3) * c_w] - 9 * tmp[(y - 2) * c_w] +
                 35 * tmp[(y - 1) * c_w] + 114 * tmp[y * c_w] -
                 17 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] +
                 4 * tmp[(c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
        _dst += c_sz - c_w;
        tmp -= c_w;
      } break;
      case 2: {
        /*Slide C_r down a quarter-pel.
          This is the same as the horizontal filter.*/
        for (x = 0; x < c_w; x++) {
          for (y = 0; y < OC_MINI(c_h, 2); y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[0] - 17 * tmp[OC_MAXI(y - 1, 0) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] +
                 tmp[OC_MINI(y + 3, c_h - 1) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h - 3; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[(y + 1) * c_w] -
                 9 * tmp[(y + 2) * c_w] + tmp[(y + 3) * c_w] + 64) >>
                    7,
                255);
          }
          for (; y < c_h; y++) {
            _dst[y * c_w] = (unsigned char)OC_CLAMPI(
                0,
                (4 * tmp[(y - 2) * c_w] - 17 * tmp[(y - 1) * c_w] +
                 114 * tmp[y * c_w] + 35 * tmp[OC_MINI(y + 1, c_h - 1) * c_w] -
                 9 * tmp[OC_MINI(y + 2, c_h - 1) * c_w] + tmp[(c_h - 1) * c_w] +
                 64) >>
                    7,
                255);
          }
          _dst++;
          tmp++;
        }
      } break;
    }
    /*For actual interlaced material, this would have to be done separately on
       each field, and the shift amounts would be different.
      C_r moves down 1/8, C_b up 3/8 in the top field, and C_r moves down 3/8,
       C_b up 1/8 in the bottom field.
      The corresponding filters would be:
       Down 1/8 (reverse order for up): [3 -11 125 15 -4 0]/128
       Down 3/8 (reverse order for up): [4 -19 98 56 -13 2]/128*/
  }
}